

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_curves.c
# Opt level: O2

int mbedtls_ecp_group_load(mbedtls_ecp_group *grp,mbedtls_ecp_group_id id)

{
  mbedtls_mpi *X;
  int iVar1;
  mbedtls_mpi_uint *pmVar2;
  size_t sVar3;
  mbedtls_mpi_uint *pmVar4;
  mbedtls_mpi_uint *pmVar5;
  mbedtls_mpi_uint *pmVar6;
  mbedtls_mpi_uint *pmVar7;
  mbedtls_mpi_uint *gx;
  size_t alen;
  
  mbedtls_ecp_group_free(grp);
  grp->id = id;
  switch(id) {
  case MBEDTLS_ECP_DP_SECP192R1:
    grp->modp = ecp_mod_p192;
    sVar3 = 0x18;
    pmVar2 = secp192r1_n;
    pmVar6 = secp192r1_gy;
    pmVar7 = secp192r1_gx;
    pmVar4 = secp192r1_p;
    pmVar5 = secp192r1_b;
    break;
  case MBEDTLS_ECP_DP_SECP224R1:
    grp->modp = ecp_mod_p224;
    sVar3 = 0x20;
    pmVar2 = secp224r1_n;
    pmVar6 = secp224r1_gy;
    pmVar7 = secp224r1_gx;
    pmVar4 = secp224r1_p;
    pmVar5 = secp224r1_b;
    break;
  case MBEDTLS_ECP_DP_SECP256R1:
    grp->modp = ecp_mod_p256;
    sVar3 = 0x20;
    pmVar2 = secp256r1_n;
    pmVar6 = secp256r1_gy;
    pmVar7 = secp256r1_gx;
    pmVar4 = secp256r1_p;
    pmVar5 = secp256r1_b;
    break;
  case MBEDTLS_ECP_DP_SECP384R1:
    grp->modp = ecp_mod_p384;
    sVar3 = 0x30;
    pmVar2 = secp384r1_n;
    pmVar6 = secp384r1_gy;
    pmVar7 = secp384r1_gx;
    pmVar4 = secp384r1_p;
    pmVar5 = secp384r1_b;
    break;
  case MBEDTLS_ECP_DP_SECP521R1:
    grp->modp = ecp_mod_p521;
    sVar3 = 0x48;
    pmVar2 = secp521r1_n;
    pmVar6 = secp521r1_gy;
    pmVar7 = secp521r1_gx;
    pmVar4 = secp521r1_p;
    pmVar5 = secp521r1_b;
    break;
  case MBEDTLS_ECP_DP_BP256R1:
    sVar3 = 0x20;
    pmVar2 = brainpoolP256r1_n;
    pmVar7 = brainpoolP256r1_gy;
    gx = brainpoolP256r1_gx;
    pmVar5 = brainpoolP256r1_p;
    pmVar4 = brainpoolP256r1_a;
    pmVar6 = brainpoolP256r1_b;
    alen = sVar3;
    goto LAB_0012837a;
  case MBEDTLS_ECP_DP_BP384R1:
    sVar3 = 0x30;
    pmVar2 = brainpoolP384r1_n;
    pmVar7 = brainpoolP384r1_gy;
    gx = brainpoolP384r1_gx;
    pmVar5 = brainpoolP384r1_p;
    pmVar4 = brainpoolP384r1_a;
    pmVar6 = brainpoolP384r1_b;
    alen = sVar3;
    goto LAB_0012837a;
  case MBEDTLS_ECP_DP_BP512R1:
    sVar3 = 0x40;
    pmVar2 = brainpoolP512r1_n;
    pmVar7 = brainpoolP512r1_gy;
    gx = brainpoolP512r1_gx;
    pmVar5 = brainpoolP512r1_p;
    pmVar4 = brainpoolP512r1_a;
    pmVar6 = brainpoolP512r1_b;
    alen = sVar3;
    goto LAB_0012837a;
  case MBEDTLS_ECP_DP_CURVE25519:
    grp->modp = ecp_mod_p255;
    iVar1 = mbedtls_mpi_read_string(&grp->A,0x10,"01DB42");
    if (iVar1 == 0) {
      X = &grp->P;
      iVar1 = mbedtls_mpi_lset(X,1);
      if (((iVar1 == 0) && (iVar1 = mbedtls_mpi_shift_l(X,0xff), iVar1 == 0)) &&
         (iVar1 = mbedtls_mpi_sub_int(X,X,0x13), iVar1 == 0)) {
        sVar3 = mbedtls_mpi_bitlen(X);
        grp->pbits = sVar3;
        iVar1 = mbedtls_mpi_lset(&(grp->G).X,9);
        if ((iVar1 == 0) && (iVar1 = mbedtls_mpi_lset(&(grp->G).Z,1), iVar1 == 0)) {
          mbedtls_mpi_free(&(grp->G).Y);
          grp->nbits = 0xfe;
          return 0;
        }
      }
    }
    mbedtls_ecp_group_free(grp);
    return iVar1;
  case MBEDTLS_ECP_DP_SECP192K1:
    grp->modp = ecp_mod_p192k1;
    sVar3 = 0x18;
    pmVar2 = secp192k1_n;
    pmVar7 = secp192k1_gy;
    gx = secp192k1_gx;
    pmVar5 = secp192k1_p;
    pmVar4 = secp192k1_a;
    pmVar6 = secp192k1_b;
    goto LAB_00128369;
  case MBEDTLS_ECP_DP_SECP224K1:
    grp->modp = ecp_mod_p224k1;
    sVar3 = 0x20;
    pmVar2 = secp224k1_n;
    pmVar7 = secp224k1_gy;
    gx = secp224k1_gx;
    pmVar5 = secp224k1_p;
    pmVar4 = secp224k1_a;
    pmVar6 = secp224k1_b;
    goto LAB_00128369;
  case MBEDTLS_ECP_DP_SECP256K1:
    grp->modp = ecp_mod_p256k1;
    sVar3 = 0x20;
    pmVar2 = secp256k1_n;
    pmVar7 = secp256k1_gy;
    gx = secp256k1_gx;
    pmVar5 = secp256k1_p;
    pmVar4 = secp256k1_a;
    pmVar6 = secp256k1_b;
LAB_00128369:
    alen = 8;
LAB_0012837a:
    ecp_group_load(grp,pmVar5,sVar3,pmVar4,alen,pmVar6,alen,gx,sVar3,pmVar7,sVar3,pmVar2,sVar3);
    return 0;
  default:
    mbedtls_ecp_group_free(grp);
    return -0x4e80;
  }
  ecp_group_load(grp,pmVar4,sVar3,(mbedtls_mpi_uint *)0x0,0,pmVar5,sVar3,pmVar7,sVar3,pmVar6,sVar3,
                 pmVar2,sVar3);
  return 0;
}

Assistant:

int mbedtls_ecp_group_load( mbedtls_ecp_group *grp, mbedtls_ecp_group_id id )
{
    mbedtls_ecp_group_free( grp );

    grp->id = id;

    switch( id )
    {
#if defined(MBEDTLS_ECP_DP_SECP192R1_ENABLED)
        case MBEDTLS_ECP_DP_SECP192R1:
            NIST_MODP( p192 );
            return( LOAD_GROUP( secp192r1 ) );
#endif /* MBEDTLS_ECP_DP_SECP192R1_ENABLED */

#if defined(MBEDTLS_ECP_DP_SECP224R1_ENABLED)
        case MBEDTLS_ECP_DP_SECP224R1:
            NIST_MODP( p224 );
            return( LOAD_GROUP( secp224r1 ) );
#endif /* MBEDTLS_ECP_DP_SECP224R1_ENABLED */

#if defined(MBEDTLS_ECP_DP_SECP256R1_ENABLED)
        case MBEDTLS_ECP_DP_SECP256R1:
            NIST_MODP( p256 );
            return( LOAD_GROUP( secp256r1 ) );
#endif /* MBEDTLS_ECP_DP_SECP256R1_ENABLED */

#if defined(MBEDTLS_ECP_DP_SECP384R1_ENABLED)
        case MBEDTLS_ECP_DP_SECP384R1:
            NIST_MODP( p384 );
            return( LOAD_GROUP( secp384r1 ) );
#endif /* MBEDTLS_ECP_DP_SECP384R1_ENABLED */

#if defined(MBEDTLS_ECP_DP_SECP521R1_ENABLED)
        case MBEDTLS_ECP_DP_SECP521R1:
            NIST_MODP( p521 );
            return( LOAD_GROUP( secp521r1 ) );
#endif /* MBEDTLS_ECP_DP_SECP521R1_ENABLED */

#if defined(MBEDTLS_ECP_DP_SECP192K1_ENABLED)
        case MBEDTLS_ECP_DP_SECP192K1:
            grp->modp = ecp_mod_p192k1;
            return( LOAD_GROUP_A( secp192k1 ) );
#endif /* MBEDTLS_ECP_DP_SECP192K1_ENABLED */

#if defined(MBEDTLS_ECP_DP_SECP224K1_ENABLED)
        case MBEDTLS_ECP_DP_SECP224K1:
            grp->modp = ecp_mod_p224k1;
            return( LOAD_GROUP_A( secp224k1 ) );
#endif /* MBEDTLS_ECP_DP_SECP224K1_ENABLED */

#if defined(MBEDTLS_ECP_DP_SECP256K1_ENABLED)
        case MBEDTLS_ECP_DP_SECP256K1:
            grp->modp = ecp_mod_p256k1;
            return( LOAD_GROUP_A( secp256k1 ) );
#endif /* MBEDTLS_ECP_DP_SECP256K1_ENABLED */

#if defined(MBEDTLS_ECP_DP_BP256R1_ENABLED)
        case MBEDTLS_ECP_DP_BP256R1:
            return( LOAD_GROUP_A( brainpoolP256r1 ) );
#endif /* MBEDTLS_ECP_DP_BP256R1_ENABLED */

#if defined(MBEDTLS_ECP_DP_BP384R1_ENABLED)
        case MBEDTLS_ECP_DP_BP384R1:
            return( LOAD_GROUP_A( brainpoolP384r1 ) );
#endif /* MBEDTLS_ECP_DP_BP384R1_ENABLED */

#if defined(MBEDTLS_ECP_DP_BP512R1_ENABLED)
        case MBEDTLS_ECP_DP_BP512R1:
            return( LOAD_GROUP_A( brainpoolP512r1 ) );
#endif /* MBEDTLS_ECP_DP_BP512R1_ENABLED */

#if defined(MBEDTLS_ECP_DP_CURVE25519_ENABLED)
        case MBEDTLS_ECP_DP_CURVE25519:
            grp->modp = ecp_mod_p255;
            return( ecp_use_curve25519( grp ) );
#endif /* MBEDTLS_ECP_DP_CURVE25519_ENABLED */

        default:
            mbedtls_ecp_group_free( grp );
            return( MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE );
    }
}